

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

bool baryonyx::itm::
     affect<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
               (solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,double kappa,
               double delta)

{
  double dVar1;
  int iVar2;
  rc_data *prVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  undefined8 in_XMM0_Qb;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 in_XMM1_Qb;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pdVar12 = (slv->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl;
  dVar1 = pdVar12[k];
  if (selected < 0) {
    lVar10 = 0;
    auVar17._0_8_ = kappa / (1.0 - kappa);
    auVar17._8_8_ = in_XMM0_Qb;
    auVar5._8_8_ = in_XMM1_Qb;
    auVar5._0_8_ = delta;
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         ((slv->R)._M_t.
          super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
         ._M_head_impl)->value * 0.5;
    auVar5 = vfmadd213sd_fma(auVar21,auVar17,auVar5);
    for (; (ulong)(uint)r_size << 4 != lVar10; lVar10 = lVar10 + 0x10) {
      prVar3 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      iVar2 = *(int *)((long)&prVar3->id + lVar10);
      if (*(int *)((long)&prVar3->f + lVar10) < 0) {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar12 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar19 = auVar5._0_8_ + pdVar12[lVar11];
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar12 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar19 = pdVar12[lVar11] - auVar5._0_8_;
      }
      pdVar12[lVar11] = dVar19;
    }
  }
  else if ((int)(selected + 1U) < r_size) {
    prVar3 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    uVar13 = (ulong)(selected + 1U);
    uVar14 = 0;
    pdVar12[k] = (prVar3[(uint)selected].value + prVar3[uVar13].value) * 0.5 + dVar1;
    auVar16._0_8_ = kappa / (1.0 - kappa);
    auVar16._8_8_ = in_XMM0_Qb;
    auVar6._8_8_ = in_XMM1_Qb;
    auVar6._0_8_ = delta;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = prVar3[uVar13].value - prVar3[(uint)selected].value;
    auVar5 = vfmadd213sd_fma(auVar20,auVar16,auVar6);
    dVar19 = auVar5._0_8_;
    for (; uVar13 * 0x10 != uVar14; uVar14 = uVar14 + 0x10) {
      prVar3 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      iVar2 = *(int *)((long)&prVar3->id + uVar14);
      if (*(int *)((long)&prVar3->f + uVar14) < 0) {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        lVar10 = (long)it[iVar2].value;
        pdVar12 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar4 = pdVar12[lVar10] - dVar19;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        lVar10 = (long)it[iVar2].value;
        pdVar12 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar4 = dVar19 + pdVar12[lVar10];
      }
      pdVar12[lVar10] = dVar4;
    }
    uVar14 = uVar13 * 0x10 | 0xc;
    lVar10 = (uint)r_size - uVar13;
    while (bVar15 = lVar10 != 0, lVar10 = lVar10 + -1, bVar15) {
      prVar3 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      iVar2 = *(int *)((long)&prVar3->value + uVar14);
      if (*(int *)((long)prVar3 + (uVar14 - 4)) < 0) {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar12 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar4 = dVar19 + pdVar12[lVar11];
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar12 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar4 = pdVar12[lVar11] - dVar19;
      }
      pdVar12[lVar11] = dVar4;
      uVar14 = uVar14 + 0x10;
    }
  }
  else {
    lVar10 = 0;
    auVar18._0_8_ = kappa / (1.0 - kappa);
    auVar18._8_8_ = in_XMM0_Qb;
    auVar7._8_8_ = in_XMM1_Qb;
    auVar7._0_8_ = delta;
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         (slv->R)._M_t.
         super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
         .
         super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
         ._M_head_impl[(uint)selected].value * 1.5;
    auVar5 = vfmadd213sd_fma(auVar22,auVar18,auVar7);
    for (; (ulong)(uint)r_size << 4 != lVar10; lVar10 = lVar10 + 0x10) {
      prVar3 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      iVar2 = *(int *)((long)&prVar3->id + lVar10);
      if (*(int *)((long)&prVar3->f + lVar10) < 0) {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar12 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar19 = pdVar12[lVar11] - auVar5._0_8_;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        lVar11 = (long)it[iVar2].value;
        pdVar12 = (slv->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl;
        dVar19 = auVar5._0_8_ + pdVar12[lVar11];
      }
      pdVar12[lVar11] = dVar19;
    }
  }
  bVar15 = is_valid_constraint<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
                     (slv,k,x);
  if (bVar15) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1;
    uVar9 = vmovmskpd_avx(auVar8);
    return (bool)((byte)((byte)(((ulong)uVar9 << 0x3f) >> 0x38) ^
                        (byte)((ulong)(slv->pi)._M_t.
                                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                      .super__Head_base<0UL,_double_*,_false>._M_head_impl[k] >>
                              0x38)) >> 7);
  }
  details::fail_fast("Precondition","is_valid_constraint(slv, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                     ,"464");
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}